

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3rbu_step(sqlite3rbu *p)

{
  RbuObjIter *pIter;
  int *piVar1;
  char **pzErrmsg;
  RbuUpdateStmt **ppRVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  u8 uVar5;
  uchar uVar6;
  sqlite3_file *psVar7;
  sqlite3_file *psVar8;
  int iVar9;
  int iVar10;
  Mem *pMVar11;
  ulong uVar12;
  char *pcVar13;
  uchar *__s2;
  RbuUpdateStmt *pRVar14;
  size_t sVar15;
  sqlite3_value *psVar16;
  uint uVar17;
  RbuUpdateStmt **ppRVar18;
  char *pcVar19;
  RbuUpdateStmt *pRVar20;
  char *zFmt;
  char *pcVar21;
  RbuFrame *pRVar22;
  long lVar23;
  RbuUpdateStmt **ppRVar24;
  sqlite3_stmt *psVar25;
  u32 uVar26;
  uint uVar27;
  bool bVar28;
  sqlite3_stmt *pStmt;
  sqlite3_stmt *local_40;
  char *local_38;
  
  if (p == (sqlite3rbu *)0x0) {
    return 7;
  }
  iVar9 = p->eStage;
  if (iVar9 == 4) {
    if (p->rc != 0) goto LAB_0014224e;
    iVar9 = p->nStep;
    if (iVar9 < p->nFrame) {
      pRVar22 = p->aFrame;
      uVar26 = pRVar22[iVar9].iDbPage;
      uVar27 = p->nPagePerSector;
      do {
        psVar8 = p->pTargetFd->pReal;
        psVar7 = p->pTargetFd->pWalFd->pReal;
        iVar10 = (*psVar7->pMethods->xRead)
                           (psVar7,p->aBuf,p->pgsz,
                            ((long)p->pgsz + 0x18) * (ulong)(pRVar22[iVar9].iWalFrame - 1) + 0x38);
        p->rc = iVar10;
        bVar28 = true;
        if (iVar10 == 0) {
          iVar9 = (*psVar8->pMethods->xWrite)
                            (psVar8,p->aBuf,p->pgsz,
                             (ulong)(pRVar22[iVar9].iDbPage - 1) * (long)p->pgsz);
          p->rc = iVar9;
          bVar28 = iVar9 != 0;
        }
        iVar10 = p->nStep;
        iVar9 = iVar10 + 1;
        p->nStep = iVar9;
        if (p->nFrame <= iVar9) break;
        uVar17 = (uVar26 - 1) / uVar27;
        pRVar22 = p->aFrame;
        uVar26 = pRVar22[(long)iVar10 + 1].iDbPage;
        uVar27 = p->nPagePerSector;
      } while (!(bool)(uVar17 != (uVar26 - 1) / uVar27 | bVar28));
    }
    else {
      psVar8 = p->pTargetFd->pReal;
      iVar9 = (*psVar8->pMethods->xSync)(psVar8,2);
      p->rc = iVar9;
      if (iVar9 == 0) {
        iVar9 = (*psVar8->pMethods->xShmMap)(psVar8,0,0x8000,0,&local_40);
        p->rc = iVar9;
        if ((iVar9 == 0) && (*(u32 *)(local_40 + 0x60) = p->iMaxFrame, p->rc == 0)) {
          p->eStage = 5;
          p->rc = 0x65;
        }
      }
    }
  }
  else {
    if (iVar9 != 2) {
      if (iVar9 == 1) {
        if (((p->zTarget == (char *)0x0) && (p->nProgress == 0)) && (p->rc == 0)) {
          rbuCreateTargetSchema(p);
          rbuCopyPragma(p,"user_version");
          rbuCopyPragma(p,"application_id");
        }
        if (p->rc == 0) {
          pIter = &p->objiter;
          piVar1 = &p->rc;
          ppRVar2 = &(p->objiter).pRbuUpdate;
          pzErrmsg = &p->zErrmsg;
          do {
            if ((p->objiter).zTbl == (char *)0x0) {
              rbuSaveState(p,2);
              if (p->rc == 0) {
                iVar9 = prepareAndCollectError
                                  (*(sqlite3 **)
                                    (p->zStateDb + (ulong)(p->zTarget == (char *)0x0) * 8 + -0x28),
                                   &local_40,pzErrmsg,"PRAGMA schema_version");
                p->rc = iVar9;
                if (iVar9 == 0) {
                  iVar9 = sqlite3_step(local_40);
                  if (iVar9 == 100) {
                    pMVar11 = columnMem(local_40,0);
                    sqlite3VdbeIntValue(pMVar11);
                    columnMallocFailure(local_40);
                  }
                  rbuFinalize(p,local_40);
                  if ((p->rc == 0) &&
                     (rbuMPrintfExec(p,p->dbMain,"PRAGMA schema_version = %d"), p->rc == 0)) {
                    iVar9 = sqlite3_exec(p->dbMain,"COMMIT",(sqlite3_callback)0x0,(void *)0x0,
                                         pzErrmsg);
                    p->rc = iVar9;
                    if (iVar9 == 0) {
                      iVar9 = sqlite3_exec(p->dbRbu,"COMMIT",(sqlite3_callback)0x0,(void *)0x0,
                                           pzErrmsg);
                      p->rc = iVar9;
                    }
                  }
                }
              }
              p->eStage = 2;
              break;
            }
            if ((p->objiter).bCleanup == 0) {
              rbuObjIterPrepareAll(p,pIter,0);
              if (p->rc != 0) goto LAB_00141faf;
              iVar9 = sqlite3_step((p->objiter).pSelect);
              if (iVar9 != 100) {
                iVar9 = sqlite3_reset((p->objiter).pSelect);
                p->rc = iVar9;
                p->nStep = 0;
                goto LAB_00141faf;
              }
              uVar3 = p->nStep;
              uVar4 = p->nProgress;
              p->nStep = uVar3 + 1;
              p->nProgress = uVar4 + 1;
              iVar9 = (p->objiter).nCol;
              psVar25 = (p->objiter).pSelect;
              pMVar11 = columnMem(psVar25,iVar9);
              uVar5 = "\x04\x05\x03\x05\x01\x05\x01\x05\x02\x05\x02\x05\x01\x05\x01\x05\x04\x05\x03\x05\x01\x05\x01\x05\x02\x05\x02\x05\x01\x05\x01\x05"
                      [pMVar11->flags & 0x1f];
              columnMallocFailure(psVar25);
              if (uVar5 == '\x03') {
                __s2 = sqlite3_column_text((p->objiter).pSelect,iVar9);
                iVar9 = 6;
                if (__s2 == (uchar *)0x0) {
                  *piVar1 = 7;
                  iVar9 = 6;
                  goto LAB_00142462;
                }
                goto LAB_00142465;
              }
              if (uVar5 != '\x01') {
switchD_001423df_default:
                *piVar1 = 1;
                pcVar13 = sqlite3_mprintf("invalid rbu_control value");
                *pzErrmsg = pcVar13;
                break;
              }
              psVar25 = (p->objiter).pSelect;
              pMVar11 = columnMem(psVar25,iVar9);
              uVar12 = sqlite3VdbeIntValue(pMVar11);
              columnMallocFailure(psVar25);
              switch(uVar12 & 0xffffffff) {
              case 0:
                iVar9 = 1;
                break;
              case 1:
                iVar9 = 2;
                break;
              case 2:
                iVar9 = 3;
                break;
              case 3:
                iVar9 = 4;
                goto LAB_00142443;
              case 4:
                iVar9 = 5;
LAB_00142443:
                if ((p->objiter).zIdx != (char *)0x0) {
                  bVar28 = false;
                  __s2 = (uchar *)0x0;
                  goto LAB_00142470;
                }
                *piVar1 = 1;
                pcVar13 = sqlite3_mprintf("invalid rbu_control value");
                *pzErrmsg = pcVar13;
                goto LAB_0014224e;
              default:
                goto switchD_001423df_default;
              }
LAB_00142462:
              __s2 = (uchar *)0x0;
LAB_00142465:
              bVar28 = (p->objiter).zIdx == (char *)0x0;
LAB_00142470:
              if (iVar9 == 6) {
                p->nPhaseOneStep = p->nPhaseOneStep - (long)(p->objiter).nIndex;
                pRVar20 = (p->objiter).pRbuUpdate;
                if (pRVar20 == (RbuUpdateStmt *)0x0) goto LAB_0014259e;
                iVar9 = strcmp(pRVar20->zMask,(char *)__s2);
                ppRVar24 = ppRVar2;
                if (iVar9 == 0) goto LAB_0014252d;
                uVar27 = 0;
                goto LAB_001424e7;
              }
              if (iVar9 == 3) {
                if (bVar28) {
                  p->nPhaseOneStep = p->nPhaseOneStep + (long)(p->objiter).nIndex;
                  rbuStepOneOp(p,2);
                }
                if (*piVar1 != 0) break;
                iVar9 = 1;
              }
              rbuStepOneOp(p,iVar9);
              break;
            }
            if ((p->zTarget != (char *)0x0) && ((p->objiter).abIndexed != (u8 *)0x0)) {
              rbuMPrintfExec(p,p->dbRbu,"DELETE FROM %s.\'rbu_tmp_%q\'",p->zStateDb,
                             (p->objiter).zDataTbl);
            }
LAB_00141faf:
            rbuObjIterNext(p,pIter);
          } while (p->rc == 0);
        }
      }
      goto LAB_0014224e;
    }
    if (p->rc != 0) goto LAB_0014224e;
    pcVar13 = sqlite3_db_filename(p->dbMain,"main");
    if (p->zTarget == (char *)0x0) {
      pcVar13 = sqlite3_db_filename(p->dbRbu,"main");
    }
    pcVar19 = sqlite3_mprintf("%s-oal",pcVar13);
    pcVar13 = sqlite3_mprintf("%s-wal",pcVar13);
    if (pcVar19 == (char *)0x0 || pcVar13 == (char *)0x0) {
      p->rc = 7;
    }
    else {
      psVar8 = p->pTargetFd->pReal;
      iVar9 = (*psVar8->pMethods->xLock)(psVar8,1);
      p->rc = iVar9;
      if (iVar9 == 0) {
        iVar9 = (*psVar8->pMethods->xLock)(psVar8,4);
        p->rc = iVar9;
        if (iVar9 == 0) {
          rbuObjIterFinalize(&p->objiter);
          sqlite3Close(p->dbRbu,0);
          sqlite3Close(p->dbMain,0);
          p->dbMain = (sqlite3 *)0x0;
          p->dbRbu = (sqlite3 *)0x0;
          iVar10 = rename(pcVar19,pcVar13);
          iVar9 = 10;
          if (iVar10 == 0) {
            iVar9 = 0;
          }
          p->rc = iVar9;
          if (iVar10 == 0) {
            rbuOpenDatabase(p,(int *)0x0);
            rbuSetupCheckpoint(p,(RbuState *)0x0);
          }
        }
      }
    }
    sqlite3_free(pcVar13);
    sqlite3_free(pcVar19);
  }
  p->nProgress = p->nProgress + 1;
  goto LAB_0014224e;
code_r0x00142508:
  ppRVar24 = &pRVar14->pNext;
LAB_0014252d:
  *ppRVar24 = pRVar20->pNext;
  pRVar20->pNext = *ppRVar2;
  *ppRVar2 = pRVar20;
  psVar25 = pRVar20->pUpdate;
  goto LAB_0014275f;
LAB_0014259e:
  pRVar14 = (RbuUpdateStmt *)rbuMalloc(p,(long)(p->objiter).nTblCol + 0x19);
  if (pRVar14 == (RbuUpdateStmt *)0x0) goto LAB_0014224e;
  goto LAB_001425ba;
LAB_001424e7:
  pRVar14 = pRVar20;
  pRVar20 = pRVar14->pNext;
  if (pRVar20 != (RbuUpdateStmt *)0x0) {
    uVar27 = uVar27 + 1;
    iVar9 = strcmp(pRVar20->zMask,(char *)__s2);
    if (iVar9 == 0) goto code_r0x00142508;
    goto LAB_001424e7;
  }
  if (uVar27 < 0xf) goto LAB_0014259e;
  do {
    ppRVar18 = ppRVar24;
    pRVar20 = *ppRVar18;
    ppRVar24 = &pRVar20->pNext;
  } while (pRVar20 != pRVar14);
  *ppRVar18 = (RbuUpdateStmt *)0x0;
  sqlite3_finalize(pRVar14->pUpdate);
  pRVar14->pUpdate = (sqlite3_stmt *)0x0;
LAB_001425ba:
  local_38 = rbuObjIterGetWhere(p,pIter);
  iVar9 = (p->objiter).nTblCol;
  if (p->rc == 0) {
    sVar15 = strlen((char *)__s2);
    if (iVar9 != (int)sVar15) {
      p->rc = 1;
      pcVar13 = sqlite3_mprintf("invalid rbu_control value");
      p->zErrmsg = pcVar13;
      iVar9 = (p->objiter).nTblCol;
      goto LAB_001426c5;
    }
    if (iVar9 < 1) goto LAB_001426c5;
    pcVar19 = "";
    lVar23 = 0;
    pcVar13 = (char *)0x0;
    do {
      uVar6 = __s2[(p->objiter).aiSrcOrder[lVar23]];
      if (uVar6 == 'd') {
        pcVar21 = (p->objiter).azTblCol[lVar23];
        zFmt = "%z%s\"%w\"=rbu_delta(\"%w\", ?%d)";
LAB_00142676:
        pcVar13 = rbuMPrintf(p,zFmt,pcVar13,pcVar19,pcVar21,pcVar21,(int)lVar23 + 1);
LAB_00142680:
        pcVar19 = ", ";
      }
      else {
        if (uVar6 == 'f') {
          pcVar21 = (p->objiter).azTblCol[lVar23];
          zFmt = "%z%s\"%w\"=rbu_fossil_delta(\"%w\", ?%d)";
          goto LAB_00142676;
        }
        if (uVar6 == 'x') {
          pcVar13 = rbuMPrintf(p,"%z%s\"%w\"=?%d",pcVar13,pcVar19,(p->objiter).azTblCol[lVar23],
                               lVar23 + 1U & 0xffffffff);
          goto LAB_00142680;
        }
      }
      lVar23 = lVar23 + 1;
      iVar9 = (p->objiter).nTblCol;
    } while (lVar23 < iVar9);
  }
  else {
LAB_001426c5:
    pcVar13 = (char *)0x0;
  }
  pRVar14->zMask = (char *)(pRVar14 + 1);
  memcpy(pRVar14 + 1,__s2,(long)iVar9);
  pcVar19 = local_38;
  pRVar14->pNext = *ppRVar2;
  *ppRVar2 = pRVar14;
  if (pcVar13 == (char *)0x0) {
    sqlite3_free(local_38);
  }
  else {
    pcVar21 = "rbu_imp_";
    if ((p->objiter).eType == 5) {
      pcVar21 = "";
    }
    pcVar21 = sqlite3_mprintf("UPDATE \"%s%w\" SET %s WHERE %s",pcVar21,(p->objiter).zTbl,pcVar13,
                              local_38);
    iVar9 = prepareFreeAndCollectError(p->dbMain,&pRVar14->pUpdate,pzErrmsg,pcVar21);
    p->rc = iVar9;
    psVar25 = pRVar14->pUpdate;
    sqlite3_free(pcVar19);
    sqlite3_free(pcVar13);
LAB_0014275f:
    if ((psVar25 != (sqlite3_stmt *)0x0) && (*piVar1 == 0)) {
      lVar23 = 0;
      do {
        iVar9 = (p->objiter).nCol;
        if (iVar9 <= lVar23) {
          if (((p->objiter).eType | 4U) == 5) {
            psVar16 = sqlite3_column_value((p->objiter).pSelect,iVar9 + 1);
            iVar9 = sqlite3_bind_value(psVar25,(p->objiter).nCol + 1,psVar16);
            p->rc = iVar9;
            if (iVar9 != 0) break;
          }
          sqlite3_step(psVar25);
          iVar9 = resetAndCollectError(psVar25,pzErrmsg);
          *piVar1 = iVar9;
          break;
        }
        uVar6 = __s2[(p->objiter).aiSrcOrder[lVar23]];
        psVar16 = sqlite3_column_value((p->objiter).pSelect,(int)lVar23);
        if (((p->objiter).abTblPk[lVar23] == '\0') && (uVar6 == '.')) {
          iVar9 = *piVar1;
        }
        else {
          iVar9 = sqlite3_bind_value(psVar25,(int)lVar23 + 1,psVar16);
          *piVar1 = iVar9;
        }
        lVar23 = lVar23 + 1;
      } while (iVar9 == 0);
    }
  }
LAB_0014224e:
  return p->rc;
}

Assistant:

SQLITE_API int sqlite3rbu_step(sqlite3rbu *p){
  if( p ){
    switch( p->eStage ){
      case RBU_STAGE_OAL: {
        RbuObjIter *pIter = &p->objiter;

        /* If this is an RBU vacuum operation and the state table was empty
        ** when this handle was opened, create the target database schema. */
        if( rbuIsVacuum(p) && p->nProgress==0 && p->rc==SQLITE_OK ){
          rbuCreateTargetSchema(p);
          rbuCopyPragma(p, "user_version");
          rbuCopyPragma(p, "application_id");
        }

        while( p->rc==SQLITE_OK && pIter->zTbl ){

          if( pIter->bCleanup ){
            /* Clean up the rbu_tmp_xxx table for the previous table. It 
            ** cannot be dropped as there are currently active SQL statements.
            ** But the contents can be deleted.  */
            if( rbuIsVacuum(p)==0 && pIter->abIndexed ){
              rbuMPrintfExec(p, p->dbRbu, 
                  "DELETE FROM %s.'rbu_tmp_%q'", p->zStateDb, pIter->zDataTbl
              );
            }
          }else{
            rbuObjIterPrepareAll(p, pIter, 0);

            /* Advance to the next row to process. */
            if( p->rc==SQLITE_OK ){
              int rc = sqlite3_step(pIter->pSelect);
              if( rc==SQLITE_ROW ){
                p->nProgress++;
                p->nStep++;
                return rbuStep(p);
              }
              p->rc = sqlite3_reset(pIter->pSelect);
              p->nStep = 0;
            }
          }

          rbuObjIterNext(p, pIter);
        }

        if( p->rc==SQLITE_OK ){
          assert( pIter->zTbl==0 );
          rbuSaveState(p, RBU_STAGE_MOVE);
          rbuIncrSchemaCookie(p);
          if( p->rc==SQLITE_OK ){
            p->rc = sqlite3_exec(p->dbMain, "COMMIT", 0, 0, &p->zErrmsg);
          }
          if( p->rc==SQLITE_OK ){
            p->rc = sqlite3_exec(p->dbRbu, "COMMIT", 0, 0, &p->zErrmsg);
          }
          p->eStage = RBU_STAGE_MOVE;
        }
        break;
      }

      case RBU_STAGE_MOVE: {
        if( p->rc==SQLITE_OK ){
          rbuMoveOalFile(p);
          p->nProgress++;
        }
        break;
      }

      case RBU_STAGE_CKPT: {
        if( p->rc==SQLITE_OK ){
          if( p->nStep>=p->nFrame ){
            sqlite3_file *pDb = p->pTargetFd->pReal;
  
            /* Sync the db file */
            p->rc = pDb->pMethods->xSync(pDb, SQLITE_SYNC_NORMAL);
  
            /* Update nBackfill */
            if( p->rc==SQLITE_OK ){
              void volatile *ptr;
              p->rc = pDb->pMethods->xShmMap(pDb, 0, 32*1024, 0, &ptr);
              if( p->rc==SQLITE_OK ){
                ((u32 volatile*)ptr)[24] = p->iMaxFrame;
              }
            }
  
            if( p->rc==SQLITE_OK ){
              p->eStage = RBU_STAGE_DONE;
              p->rc = SQLITE_DONE;
            }
          }else{
            /* At one point the following block copied a single frame from the
            ** wal file to the database file. So that one call to sqlite3rbu_step()
            ** checkpointed a single frame. 
            **
            ** However, if the sector-size is larger than the page-size, and the
            ** application calls sqlite3rbu_savestate() or close() immediately
            ** after this step, then rbu_step() again, then a power failure occurs,
            ** then the database page written here may be damaged. Work around
            ** this by checkpointing frames until the next page in the aFrame[]
            ** lies on a different disk sector to the current one. */
            u32 iSector;
            do{
              RbuFrame *pFrame = &p->aFrame[p->nStep];
              iSector = (pFrame->iDbPage-1) / p->nPagePerSector;
              rbuCheckpointFrame(p, pFrame);
              p->nStep++;
            }while( p->nStep<p->nFrame 
                 && iSector==((p->aFrame[p->nStep].iDbPage-1) / p->nPagePerSector)
                 && p->rc==SQLITE_OK
            );
          }
          p->nProgress++;
        }
        break;
      }

      default:
        break;
    }
    return p->rc;
  }else{
    return SQLITE_NOMEM;
  }
}